

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_mstring_get_mbs(archive *a,archive_mstring *aes,char **p)

{
  wchar_t wVar1;
  
  wVar1 = aes->aes_set;
  if ((wVar1 & 1U) == 0) {
    *p = (char *)0x0;
    if ((wVar1 & 4U) == 0) {
      return L'\0';
    }
    (aes->aes_mbs).length = 0;
    wVar1 = archive_string_append_from_wcs(&aes->aes_mbs,(aes->aes_wcs).s,(aes->aes_wcs).length);
    *p = (aes->aes_mbs).s;
    if (wVar1 != L'\0') {
      return L'\xffffffff';
    }
    *(byte *)&aes->aes_set = (byte)aes->aes_set | 1;
  }
  else {
    *p = (aes->aes_mbs).s;
  }
  return L'\0';
}

Assistant:

int
archive_mstring_get_mbs(struct archive *a, struct archive_mstring *aes,
    const char **p)
{
	int r, ret = 0;

	(void)a; /* UNUSED */
	/* If we already have an MBS form, return that immediately. */
	if (aes->aes_set & AES_SET_MBS) {
		*p = aes->aes_mbs.s;
		return (ret);
	}

	*p = NULL;
	/* If there's a WCS form, try converting with the native locale. */
	if (aes->aes_set & AES_SET_WCS) {
		archive_string_empty(&(aes->aes_mbs));
		r = archive_string_append_from_wcs(&(aes->aes_mbs),
		    aes->aes_wcs.s, aes->aes_wcs.length);
		*p = aes->aes_mbs.s;
		if (r == 0) {
			aes->aes_set |= AES_SET_MBS;
			return (ret);
		} else
			ret = -1;
	}

	/*
	 * Only a UTF-8 form cannot avail because its conversion already
	 * failed at archive_mstring_update_utf8().
	 */
	return (ret);
}